

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_NodeCollect_rec(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Int_t *vSupp)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int Entry;
  
  pGVar2 = p->pObjs;
  if (pGVar2 <= pNode) {
    do {
      if (pGVar2 + p->nObjs <= pNode) break;
      Entry = (int)((long)pNode - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= Entry) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[Entry] == p->nTravIds) {
        return;
      }
      p->pTravIds[Entry] = p->nTravIds;
      if (pGVar2 + p->nObjs <= pNode) break;
      if ((p->pRefs[Entry] != 0) || (uVar1 = (uint)*(undefined8 *)pNode, (~uVar1 & 0x9fffffff) == 0)
         ) {
        Vec_IntPush(vSupp,Entry);
        return;
      }
      if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                      ,0x4ab,"void Gia_NodeCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      Gia_NodeCollect_rec(p,pNode + -(ulong)(uVar1 & 0x1fffffff),vSupp);
      pNode = pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff);
      pGVar2 = p->pObjs;
    } while (pGVar2 <= pNode);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_NodeCollect_rec( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Int_t * vSupp )
{
    if ( Gia_ObjIsTravIdCurrent(p, pNode) )
        return;
    Gia_ObjSetTravIdCurrent(p, pNode);
    if ( Gia_ObjRefNum(p, pNode) || Gia_ObjIsCi(pNode) )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pNode) );
        return;
    }
    assert( Gia_ObjIsAnd(pNode) );
    Gia_NodeCollect_rec( p, Gia_ObjFanin0(pNode), vSupp );
    Gia_NodeCollect_rec( p, Gia_ObjFanin1(pNode), vSupp );
}